

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

int __thiscall ON_Brep::RemoveWireVertices(ON_Brep *this)

{
  uint uVar1;
  ON_BrepVertex *pOVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_count
  ;
  uVar6 = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar6;
  }
  iVar3 = 0;
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    pOVar2 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_a;
    if ((uVar4 == *(uint *)((long)&pOVar2->m_vertex_index + uVar6)) &&
       (*(int *)((long)&(pOVar2->m_ei).m_count + uVar6) == 0)) {
      iVar3 = iVar3 + 1;
      DeleteVertex(this,(ON_BrepVertex *)
                        ((long)&(pOVar2->super_ON_Point).super_ON_Geometry.super_ON_Object.
                                _vptr_ON_Object + uVar6));
    }
    uVar6 = uVar6 + 0x58;
  }
  return iVar3;
}

Assistant:

int ON_Brep::RemoveWireVertices()
{
  int rc = 0;
  int vi, count = m_V.Count();
  for ( vi = 0; vi < count; vi++ )
  {
    if ( vi == m_V[vi].m_vertex_index && 0 == m_V[vi].m_ei.Count() )
    {
      rc++;
      DeleteVertex( m_V[vi] );
    }
  }
  return rc;
}